

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertConditionalConLHS<mp::LinTerms,mp::AlgConRhs<1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                 *con,int i)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  uint uVar1;
  int iVar2;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  int iVar3;
  VarOrConst VVar4;
  NodeRange NVar5;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  LinTerms lt;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> ccnew;
  LinearFunctionalConstraint fc;
  allocator_type local_452;
  allocator_type local_451;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  local_450;
  vector<int,_std::allocator<int>_> local_448;
  int local_42c;
  LinTerms local_428;
  inline_storage<double,_6U> *local_3b0;
  ulong local_3a8;
  long local_3a0;
  inline_storage<double,_6U> local_398;
  inline_storage<int,_6U> *local_368;
  ulong local_360;
  long local_358;
  inline_storage<int,_6U> local_350;
  double local_338;
  LinTerms local_330;
  AffineExpr local_2b8;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> local_238;
  LinearFunctionalConstraint local_168;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_c0;
  
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this + -0x208);
  uVar1 = i >> 0x1f & *(uint *)(this + 0x2588);
  iVar3 = uVar1 + i;
  iVar2 = uVar1 + i + 1;
  if ((int)*(uint *)(this + 0x2588) <= iVar3) {
    *(long *)(this + 0x2588) = (long)iVar2;
  }
  *(Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    **)(this + 0x848) = this + 0x2538;
  *(ulong *)(this + 0x850) = CONCAT44(iVar2,iVar3);
  local_450.cvt_ =
       (FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this_00;
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)&local_3b0,
             &(con->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .args_.super_LinTerms);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_368,
             &(con->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
              .args_.super_LinTerms.vars_);
  if (local_3a8 < 7) {
    local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.m_storage;
    local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_3a0 != 0) {
      memcpy(local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
             m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,local_3b0,
             local_3a0 * 8);
    }
  }
  else {
    local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)local_3b0;
    local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_3a8;
    local_3a8 = 6;
    local_3a0 = 0;
    local_3b0 = &local_398;
  }
  if (local_360 < 7) {
    local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.m_storage;
    local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_358 != 0) {
      memcpy(local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,local_368,local_358 * 4);
    }
  }
  else {
    local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_368;
    local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_360;
    local_360 = 6;
    local_358 = 0;
    local_368 = &local_350;
  }
  local_2b8.constant_term_ = 0.0;
  LinearFunctionalConstraint::LinearFunctionalConstraint(&local_168,&local_2b8);
  if (6 < local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_2b8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_2b8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2b8.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_2b8.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_360) {
    operator_delete(local_368,local_360 << 2);
  }
  if (6 < local_3a8) {
    operator_delete(local_3b0,local_3a8 << 3);
  }
  VVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResult2Args<mp::LinearFunctionalConstraint>(this_00,&local_168);
  value = VVar4.field_1;
  if (((undefined1  [16])VVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(this_00,value.c_);
    value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar5.ir_;
  }
  iVar3 = value.var_;
  if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= iVar3) {
    AutoExpand<std::vector<bool,std::allocator<bool>>>
              ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(long)iVar3,false);
  }
  local_338 = 1.0;
  __l._M_len = 1;
  __l._M_array = &local_338;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_238,__l,&local_451);
  __l_00._M_len = 1;
  __l_00._M_array = &local_42c;
  local_42c = iVar3;
  std::vector<int,_std::allocator<int>_>::vector(&local_448,__l_00,&local_452);
  LinTerms::LinTerms(&local_330,(vector<double,_std::allocator<double>_> *)&local_238,&local_448);
  if (local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
         .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity -
                    (long)local_238.
                          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                          .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p);
  }
  if (local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
    local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
  }
  if (local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  }
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_c0,&local_428,
             (AlgConRhs<1>)
             (con->
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
             ).
             super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
             .args_.super_AlgConRhs<1>.rhs_,true);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  ConditionalConstraint(&local_238,&local_c0);
  if (6 < local_c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_c0.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_c0.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_c0.super_BasicConstraint.name_.field_2) {
    operator_delete(local_c0.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_c0.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_428.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_428.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)this_00,
             (con->
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
             ).super_FunctionalConstraint.result_var_,&local_238);
  iVar3 = (con->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          ).super_FunctionalConstraint.result_var_;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            (this_00,iVar3,*(double *)(*(long *)(this + -0x1c8) + (long)iVar3 * 8),
             *(double *)(*(long *)(this + -0x1b0) + (long)iVar3 * 8),
             (Context)(con->
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                      ).super_FunctionalConstraint.ctx.value_);
  if (6 < local_238.
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          .
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .args_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_238.
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          .
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                    .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                    .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
         .
         super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
         .args_.super_BasicConstraint.name_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_238.
                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                 .
                 super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                 .args_.super_BasicConstraint + 0x10U)) {
    operator_delete(local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .args_.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .args_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.
         super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
         .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_238.
                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                 .super_FunctionalConstraint.super_BasicConstraint.name_ + 0x10U)) {
    operator_delete(local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_238.
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                    .super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  if (6 < local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_330.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_330.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_168.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_168.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_168.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_168.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_168.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_168.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_168.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_168.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                    _M_p,local_168.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                         _M_allocated_capacity + 1);
  }
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&local_450);
  return;
}

Assistant:

void ConvertConditionalConLHS(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i) {
    auto alscope = MPD( MakeAutoLinker( con, i ) );       // link from \a con
    /// Create a functional constraint from the LHS
    auto fc = MakeFunctionalConstraint(
        AlgebraicExpression{con.GetConstraint().GetArguments(), 0.0});
    auto resvar = MPD( AssignResultVar2Args(std::move(fc)) );
    if ( !MPCD(VarHasMarking(resvar) ))         // mark as expr if new
      MPD( MarkAsExpression(resvar) );
    /// resvar can be a proper variable - ModelAPI should flexibly handle this
    LinTerms lt { {1.0}, {resvar} };
    ConditionalConstraint< AlgebraicConstraint<LinTerms, RhsOrRange> >
        ccnew { { std::move(lt), con.GetConstraint().GetRhsOrRange() } };
    MPD( RedefineVariable(con.GetResultVar(), std::move(ccnew)) );  // Use new CondCon
    MPD( PropagateResultOfInitExpr(con.GetResultVar(), con.GetContext()) ); // context
  }